

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddExtension(Tables *this,FieldDescriptor *field)

{
  pointer *pppVar1;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_bool>
  pVar2;
  DescriptorIntPair key;
  pair<const_google::protobuf::Descriptor_*,_int> local_38;
  pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>
  local_28;
  
  local_38.first = *(Descriptor **)(field + 0x50);
  local_38.second = *(int *)(field + 0x44);
  local_28.first.first = local_38.first;
  local_28.first.second = local_38.second;
  local_28.second = field;
  pVar2 = std::
          _Rb_tree<std::pair<google::protobuf::Descriptor_const*,int>,std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>,std::_Select1st<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>
          ::
          _M_insert_unique<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>const&>
                    ((_Rb_tree<std::pair<google::protobuf::Descriptor_const*,int>,std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>,std::_Select1st<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>
                      *)&this->extensions_,&local_28);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __position._M_current =
         (this->extensions_after_checkpoint_).
         super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->extensions_after_checkpoint_).
        super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<google::protobuf::Descriptor_const*,int>,std::allocator<std::pair<google::protobuf::Descriptor_const*,int>>>
      ::_M_realloc_insert<std::pair<google::protobuf::Descriptor_const*,int>const&>
                ((vector<std::pair<google::protobuf::Descriptor_const*,int>,std::allocator<std::pair<google::protobuf::Descriptor_const*,int>>>
                  *)&this->extensions_after_checkpoint_,__position,&local_38);
    }
    else {
      (__position._M_current)->first = local_38.first;
      *(ulong *)&(__position._M_current)->second = CONCAT44(local_38._12_4_,local_38.second);
      pppVar1 = &(this->extensions_after_checkpoint_).
                 super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  return (bool)(pVar2.second & 1);
}

Assistant:

bool DescriptorPool::Tables::AddExtension(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  if (InsertIfNotPresent(&extensions_, key, field)) {
    extensions_after_checkpoint_.push_back(key);
    return true;
  } else {
    return false;
  }
}